

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

void __thiscall despot::QNode::~QNode(QNode *this)

{
  VNode *this_00;
  bool bVar1;
  pointer ppVar2;
  _Self local_20;
  _Self local_18;
  iterator it;
  QNode *this_local;
  
  it._M_node = (_Base_ptr)this;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
       ::begin(&this->children_);
  while( true ) {
    local_20._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
         ::end(&this->children_);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) {
      std::
      map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
      ::clear(&this->children_);
      std::
      map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
      ::~map(&this->children_);
      return;
    }
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_despot::VNode_*>_>::operator->
                       (&local_18);
    if (ppVar2->second == (VNode *)0x0) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_despot::VNode_*>_>::operator->
                       (&local_18);
    this_00 = ppVar2->second;
    if (this_00 != (VNode *)0x0) {
      VNode::~VNode(this_00);
      operator_delete(this_00,0x98);
    }
    std::_Rb_tree_iterator<std::pair<const_unsigned_long,_despot::VNode_*>_>::operator++
              (&local_18,0);
  }
  __assert_fail("it->second != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/core/node.cpp"
                ,0x120,"despot::QNode::~QNode()");
}

Assistant:

QNode::~QNode() {
	for (map<OBS_TYPE, VNode*>::iterator it = children_.begin();
		it != children_.end(); it++) {
		assert(it->second != NULL);
		delete it->second;
	}
	children_.clear();
}